

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_cmdline.cpp
# Opt level: O1

bool __thiscall Omega_h::CmdLine::parse_final(CmdLine *this,CommPtr *comm,int *p_argc,char **argv)

{
  int argc;
  Comm *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  bool bVar1;
  bool bVar2;
  I32 IVar3;
  
  IVar3 = Comm::rank((comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  bVar1 = parse(this,p_argc,argv,IVar3 == 0);
  this_00 = (comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  this_01 = (comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_01->_M_use_count = this_01->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_01->_M_use_count = this_01->_M_use_count + 1;
    }
  }
  argc = *p_argc;
  IVar3 = Comm::rank(this_00);
  bVar2 = check_empty(argc,argv,IVar3 == 0);
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  }
  if (((!bVar1) || (!bVar2)) || (bVar1 = true, this->parsed_help_ != false)) {
    show_help(this,argv);
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool CmdLine::parse_final(CommPtr comm, int* p_argc, char** argv) {
  bool no_error = parse(p_argc, argv, !comm->rank());
  bool was_empty = check_empty(comm, *p_argc, argv);
  if (no_error && !parsed_help_ && was_empty) return true;
  show_help(argv);
  return false;
}